

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

void cleanup(EVP_PKEY_CTX *ctx)

{
  archive_string *as;
  undefined8 *puVar1;
  undefined8 *__ptr;
  
  as = (archive_string *)**(undefined8 **)(ctx + 0x9a8);
  __ptr = (undefined8 *)as[2].buffer_length;
  while (__ptr != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*__ptr;
    free((void *)__ptr[2]);
    free_options((mtree_option *)__ptr[1]);
    free(__ptr);
    __ptr = puVar1;
  }
  archive_string_free(as);
  archive_string_free((archive_string *)&as[3].length);
  archive_string_free((archive_string *)&as[4].length);
  archive_entry_linkresolver_free((archive_entry_linkresolver *)as[5].length);
  free((void *)as[1].length);
  free(as);
  **(undefined8 **)(ctx + 0x9a8) = 0;
  return;
}

Assistant:

static int
cleanup(struct archive_read *a)
{
	struct mtree *mtree;
	struct mtree_entry *p, *q;

	mtree = (struct mtree *)(a->format->data);

	p = mtree->entries;
	while (p != NULL) {
		q = p->next;
		free(p->name);
		free_options(p->options);
		free(p);
		p = q;
	}
	archive_string_free(&mtree->line);
	archive_string_free(&mtree->current_dir);
	archive_string_free(&mtree->contents_name);
	archive_entry_linkresolver_free(mtree->resolver);

	free(mtree->buff);
	free(mtree);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}